

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Char16Test.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  undefined8 uVar6;
  long *plVar7;
  long *plVar8;
  char16_t *pcVar9;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_48;
  
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  plVar3 = (long *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(L"LS");
  if (plVar3 == (long *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Requested DOM implementation is not supported",0x2d);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    iVar2 = 4;
  }
  else {
    plVar3 = (long *)(**(code **)(*plVar3 + 0x40))
                               (plVar3,L"https://example.com/schema/char16",L"catalogue",0,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    plVar4 = (long *)(**(code **)(*plVar3 + 0x68))(plVar3);
    plVar5 = (long *)(**(code **)(*plVar3 + 0x80))
                               (plVar3,L"https://example.com/schema/char16",L"produit");
    (**(code **)(*plVar4 + 0x88))(plVar4,plVar5);
    uVar6 = (**(code **)(*plVar3 + 0x28))(plVar3,L"Xerces-C");
    (**(code **)(*plVar5 + 0x88))(plVar5,uVar6);
    plVar7 = (long *)(**(code **)(*plVar3 + 0x80))
                               (plVar3,L"https://example.com/schema/char16",L"catégorie");
    (**(code **)(*plVar4 + 0x88))(plVar4,plVar7);
    (**(code **)(*plVar7 + 0x160))(plVar7,L"idée",L"génial");
    uVar6 = (**(code **)(*plVar3 + 0x28))(plVar3,L"produit");
    (**(code **)(*plVar7 + 0x88))(plVar7,uVar6);
    plVar8 = (long *)(**(code **)(*plVar3 + 0x80))
                               (plVar3,L"https://example.com/schema/char16",L"développéPar");
    (**(code **)(*plVar4 + 0x88))(plVar4,plVar8);
    uVar6 = (**(code **)(*plVar3 + 0x28))(plVar3,L"Fondation du logiciel Apache");
    (**(code **)(*plVar8 + 0x88))(plVar8,uVar6);
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::u16string::_M_construct<char16_t_const*>((u16string *)&local_48,L"produit",L"");
    pcVar9 = (char16_t *)(**(code **)(*plVar5 + 0x140))(plVar5);
    iVar2 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::compare
                      (&local_48,pcVar9);
    if (iVar2 != 0) {
      __assert_fail("std::u16string(u\"produit\") == prodElem->getTagName()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/Char16Test/Char16Test.cpp"
                    ,0x58,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 2 + 2);
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::u16string::_M_construct<char16_t_const*>((u16string *)&local_48,L"catégorie",L"")
    ;
    pcVar9 = (char16_t *)(**(code **)(*plVar7 + 0x140))(plVar7);
    iVar2 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::compare
                      (&local_48,pcVar9);
    if (iVar2 != 0) {
      __assert_fail(anon_var_dwarf_254d,
                    "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/Char16Test/Char16Test.cpp"
                    ,0x59,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 2 + 2);
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::u16string::_M_construct<char16_t_const*>((u16string *)&local_48,L"génial",L"");
    pcVar9 = (char16_t *)(**(code **)(*plVar7 + 0x148))(plVar7,L"idée");
    iVar2 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::compare
                      (&local_48,pcVar9);
    if (iVar2 != 0) {
      __assert_fail(anon_var_dwarf_2563,
                    "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/Char16Test/Char16Test.cpp"
                    ,0x5a,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 2 + 2);
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::u16string::_M_construct<char16_t_const*>
              ((u16string *)&local_48,L"développéPar",L"");
    pcVar9 = (char16_t *)(**(code **)(*plVar8 + 0x140))(plVar8);
    iVar2 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::compare
                      (&local_48,pcVar9);
    if (iVar2 != 0) {
      __assert_fail(anon_var_dwarf_2579,
                    "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/Char16Test/Char16Test.cpp"
                    ,0x5b,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 2 + 2);
    }
    iVar2 = 0;
  }
  xercesc_4_0::XMLPlatformUtils::Terminate();
  return iVar2;
}

Assistant:

int main() {
    try
    {
        xercesc::XMLPlatformUtils::Initialize();
    }
    catch (const xercesc::XMLException& toCatch)
    {
      std::cerr << "Error during initialization of xerces-c: "
                << toCatch.getMessage()
                << std::endl;
        return 1;
    }

    const char16_t *ns = u"https://example.com/schema/char16";

    int errorCode = 0;

    xercesc::DOMImplementation* impl = xercesc::DOMImplementationRegistry::getDOMImplementation(u"LS");
    if(impl)
    {
        try
        {
            xercesc::DOMDocument* doc = impl->createDocument
                (ns, // root element namespace URI.
                 u"catalogue", // root element name
                 nullptr);

            xercesc::DOMElement* rootElem = doc->getDocumentElement();

            xercesc::DOMElement*  prodElem = doc->createElementNS(ns, u"produit");
            rootElem->appendChild(prodElem);

            xercesc::DOMText*    prodDataVal = doc->createTextNode(u"Xerces-C");
            prodElem->appendChild(prodDataVal);

            xercesc::DOMElement*  catElem = doc->createElementNS(ns, u"catégorie");
            rootElem->appendChild(catElem);

            catElem->setAttribute(u"idée", u"génial");

            xercesc::DOMText*    catDataVal = doc->createTextNode(u"produit");
            catElem->appendChild(catDataVal);

            xercesc::DOMElement*  devByElem = doc->createElementNS(ns, u"développéPar");
            rootElem->appendChild(devByElem);

            xercesc::DOMText*    devByDataVal = doc->createTextNode(u"Fondation du logiciel Apache");
            devByElem->appendChild(devByDataVal);

            assert(std::u16string(u"produit") == prodElem->getTagName());
            assert(std::u16string(u"catégorie") == catElem->getTagName());
            assert(std::u16string(u"génial") == catElem->getAttribute(u"idée"));
            assert(std::u16string(u"développéPar") == devByElem->getTagName());
        }
        catch (const xercesc::OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            errorCode = 5;
        }
        catch (const xercesc::DOMException& e)
        {
            std::cerr << "DOMException code is:  " << e.code << std::endl;
            errorCode = 2;
        }
        catch (...)
        {
            std::cerr << "An error occurred creating the document" << std::endl;
            errorCode = 3;
        }
    }
    else
    {
        std::cerr << "Requested DOM implementation is not supported" << std::endl;
        errorCode = 4;
    }

    xercesc::XMLPlatformUtils::Terminate();
    return errorCode;
}